

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdBitmask<wabt::interp::Simd<long,(unsigned_char)2>>(Thread *this)

{
  uint uVar1;
  u8 i;
  long lVar2;
  Simd<long,_(unsigned_char)__x02_> val;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  local_18.v128_.v = (v128)Pop(this);
  lVar2 = 0;
  uVar1 = 0;
  do {
    uVar1 = uVar1 | (uint)((long)*(undefined8 *)((long)&local_18 + lVar2 * 8) >> 0x3f) &
                    1 << ((byte)lVar2 & 0x1f);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  Push(this,(Value)ZEXT416(uVar1));
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitmask() {
  auto val = Pop<S>();
  u32 result = 0;
  for (u8 i = 0; i < S::lanes; ++i) {
    if (val[i] < 0) {
      result |= 1 << i;
    }
  }
  Push(result);
  return RunResult::Ok;
}